

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

UChar32 __thiscall
icu_63::anon_unknown_16::NFDIterator::nextDecomposedCodePoint
          (NFDIterator *this,Normalizer2Impl *nfcImpl,UChar32 c)

{
  int iVar1;
  UChar *pUVar2;
  uint local_24;
  UChar32 c_local;
  Normalizer2Impl *nfcImpl_local;
  NFDIterator *this_local;
  
  this_local._4_4_ = c;
  if (this->index < 0) {
    pUVar2 = Normalizer2Impl::getDecomposition(nfcImpl,c,this->buffer,&this->length);
    this->decomp = pUVar2;
    if (this->decomp != (UChar *)0x0) {
      this->index = 0;
      iVar1 = this->index;
      this->index = iVar1 + 1;
      local_24 = (uint)(ushort)this->decomp[iVar1];
      if ((local_24 & 0xfffffc00) == 0xd800) {
        iVar1 = this->index;
        this->index = iVar1 + 1;
        local_24 = local_24 * 0x400 + (uint)(ushort)this->decomp[iVar1] + 0xfca02400;
      }
      this_local._4_4_ = local_24;
    }
  }
  return this_local._4_4_;
}

Assistant:

UChar32 nextDecomposedCodePoint(const Normalizer2Impl &nfcImpl, UChar32 c) {
        if(index >= 0) { return c; }
        decomp = nfcImpl.getDecomposition(c, buffer, length);
        if(decomp == NULL) { return c; }
        index = 0;
        U16_NEXT_UNSAFE(decomp, index, c);
        return c;
    }